

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O3

QByteArray * QByteArray::trimmed_helper(QByteArray *__return_storage_ptr__,QByteArray *a)

{
  char *pcVar1;
  long lVar2;
  Data *pDVar3;
  char *data;
  TrimPositions TVar4;
  
  TVar4 = QStringAlgorithms<const_QByteArray>::trimmed_helper_positions(a);
  data = TVar4.begin;
  pcVar1 = (a->d).ptr;
  if ((data == pcVar1) && (lVar2 = (a->d).size, TVar4.end == pcVar1 + lVar2)) {
    pDVar3 = (a->d).d;
    (__return_storage_ptr__->d).d = pDVar3;
    (__return_storage_ptr__->d).ptr = pcVar1;
    (__return_storage_ptr__->d).size = lVar2;
    if (pDVar3 != (Data *)0x0) {
      LOCK();
      (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  else {
    QByteArray(__return_storage_ptr__,data,(long)TVar4.end - (long)data);
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray QByteArray::trimmed_helper(const QByteArray &a)
{
    return QStringAlgorithms<const QByteArray>::trimmed_helper(a);
}